

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O3

void __thiscall
despot::util::tinyxml::TiXmlComment::operator=(TiXmlComment *this,TiXmlComment *base)

{
  TiXmlNode *pTVar1;
  TiXmlBase *pTVar2;
  size_t len;
  char *__s;
  
  pTVar1 = (this->super_TiXmlNode).firstChild;
  while (pTVar1 != (TiXmlNode *)0x0) {
    pTVar2 = &pTVar1->super_TiXmlBase;
    pTVar1 = pTVar1->next;
    (*pTVar2->_vptr_TiXmlBase[1])();
  }
  (this->super_TiXmlNode).firstChild = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).lastChild = (TiXmlNode *)0x0;
  __s = ((base->super_TiXmlNode).value.rep_)->str;
  len = strlen(__s);
  TiXmlString::assign(&(this->super_TiXmlNode).value,__s,len);
  (this->super_TiXmlNode).super_TiXmlBase.userData =
       (base->super_TiXmlNode).super_TiXmlBase.userData;
  return;
}

Assistant:

void TiXmlComment::operator=(const TiXmlComment& base) {
	Clear();
	base.CopyTo(this);
}